

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

void psa_fail_key_creation(psa_key_slot_t *slot,psa_se_drv_table_entry_t *driver)

{
  ushort uVar1;
  
  if (slot == (psa_key_slot_t *)0x0) {
    return;
  }
  uVar1 = (slot->attr).type;
  if (uVar1 != 0) {
    if (((uVar1 & 0x7000) != 0x2000) && ((uVar1 & 0x7000) != 0x1000)) {
      if ((uVar1 & 0xcfff) == 0x4001) {
        mbedtls_rsa_free((slot->data).rsa);
      }
      else {
        if ((uVar1 & 0xcf00) != 0x4100) goto LAB_00110abf;
        mbedtls_ecp_keypair_free((slot->data).ecp);
      }
    }
    free((slot->data).raw.data);
  }
LAB_00110abf:
  (slot->data).raw.data = (uint8_t *)0x0;
  (slot->data).raw.bytes = 0;
  (slot->attr).policy.alg = 0;
  (slot->attr).policy.alg2 = 0;
  *(undefined8 *)&(slot->attr).flags = 0;
  (slot->attr).type = 0;
  (slot->attr).bits = 0;
  (slot->attr).lifetime = 0;
  (slot->attr).id = 0;
  (slot->attr).policy.usage = 0;
  return;
}

Assistant:

static void psa_fail_key_creation( psa_key_slot_t *slot,
                                   psa_se_drv_table_entry_t *driver )
{
    (void) driver;

    if( slot == NULL )
        return;

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    /* TODO: If the key has already been created in the secure
     * element, and the failure happened later (when saving metadata
     * to internal storage), we need to destroy the key in the secure
     * element.
     * https://github.com/ARMmbed/mbed-crypto/issues/217
     */

    /* Abort the ongoing transaction if any (there may not be one if
     * the creation process failed before starting one, or if the
     * key creation is a registration of a key in a secure element).
     * Earlier functions must already have done what it takes to undo any
     * partial creation. All that's left is to update the transaction data
     * itself. */
    (void) psa_crypto_stop_transaction( );
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    psa_wipe_key_slot( slot );
}